

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_map.h
# Opt level: O1

void __thiscall
cppcms::impl::details::
intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
::erase(intrusive_list<cppcms::impl::details::basic_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data,_cppcms::impl::string_hash,_cppcms::impl::details::are_equal,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::sessions::session_memory_storage::_data>_>_>::container>
        *this,container *p)

{
  container *pcVar1;
  container *pcVar2;
  
  pcVar1 = p->prev;
  if (pcVar1 != (container *)0x0) {
    pcVar1->next = p->next;
  }
  pcVar2 = p->next;
  if (pcVar2 != (container *)0x0) {
    pcVar2->prev = pcVar1;
  }
  if (this->begin == p) {
    this->begin = pcVar2;
  }
  if (this->end == p) {
    this->end = p->prev;
  }
  p->next = (container *)0x0;
  p->prev = (container *)0x0;
  return;
}

Assistant:

void erase(T *p)
	{
		if(p->prev) {
			p->prev->next = p->next;
		}
		if(p->next) {
			p->next->prev = p->prev;
		}
		if(begin == p)
			begin = p->next;
		if(end == p)
			end = p->prev;
		p->next = p->prev = 0;
	}